

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O3

_Bool ppk_encrypted_f(Filename *filename,char **commentptr)

{
  _Bool _Var1;
  LoadedFile *lf;
  
  lf = lf_load_keyfile(filename,(char **)0x0);
  if (lf == (LoadedFile *)0x0) {
    if (commentptr != (char **)0x0) {
      *commentptr = (char *)0x0;
    }
    _Var1 = false;
  }
  else {
    _Var1 = ppk_encrypted_s(lf->binarysource_,commentptr);
    lf_free(lf);
  }
  return _Var1;
}

Assistant:

bool ppk_encrypted_f(const Filename *filename, char **commentptr)
{
    LoadedFile *lf = lf_load_keyfile(filename, NULL);
    if (!lf) {
        if (commentptr)
            *commentptr = NULL;
        return false;
    }

    bool toret = ppk_encrypted_s(BinarySource_UPCAST(lf), commentptr);
    lf_free(lf);
    return toret;
}